

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_has_hot_journal(Pager *pPager,int *pExists)

{
  int iVar1;
  unqlite_int64 local_38;
  sxi64 n;
  int local_28;
  int locked;
  int exists;
  int rc;
  unqlite_vfs *pVfs;
  int *pExists_local;
  Pager *pPager_local;
  
  _exists = pPager->pVfs;
  locked = 0;
  local_28 = 1;
  *pExists = 0;
  pVfs = (unqlite_vfs *)pExists;
  pExists_local = (int *)pPager;
  locked = unqliteOsAccess(_exists,pPager->zJournal,0,&local_28);
  if ((locked == 0) && (local_28 != 0)) {
    n._4_4_ = 0;
    locked = unqliteOsCheckReservedLock
                       (*(unqlite_file **)(pExists_local + 0xc),(int *)((long)&n + 4));
    if ((locked == 0) && (n._4_4_ == 0)) {
      local_38 = 0;
      locked = unqliteOsFileSize(*(unqlite_file **)(pExists_local + 0xc),&local_38);
      if (locked == 0) {
        if (local_38 < 1) {
          iVar1 = pager_lock_db((Pager *)pExists_local,2);
          if (iVar1 == 0) {
            unqliteOsDelete(_exists,*(char **)(pExists_local + 8),0);
            pager_unlock_db((Pager *)pExists_local,1);
          }
        }
        else {
          *(undefined4 *)&pVfs->zName = 1;
        }
      }
    }
  }
  return locked;
}

Assistant:

static int pager_has_hot_journal(Pager *pPager, int *pExists)
{
  unqlite_vfs *pVfs = pPager->pVfs;
  int rc = UNQLITE_OK;           /* Return code */
  int exists = 1;               /* True if a journal file is present */

  *pExists = 0;
  rc = unqliteOsAccess(pVfs, pPager->zJournal, UNQLITE_ACCESS_EXISTS, &exists);
  if( rc==UNQLITE_OK && exists ){
    int locked = 0;             /* True if some process holds a RESERVED lock */

    /* Race condition here:  Another process might have been holding the
    ** the RESERVED lock and have a journal open at the unqliteOsAccess() 
    ** call above, but then delete the journal and drop the lock before
    ** we get to the following unqliteOsCheckReservedLock() call.  If that
    ** is the case, this routine might think there is a hot journal when
    ** in fact there is none.  This results in a false-positive which will
    ** be dealt with by the playback routine.
    */
    rc = unqliteOsCheckReservedLock(pPager->pfd, &locked);
    if( rc==UNQLITE_OK && !locked ){
      sxi64 n = 0;                    /* Size of db file in bytes */
 
      /* Check the size of the database file. If it consists of 0 pages,
      ** then delete the journal file. See the header comment above for 
      ** the reasoning here.  Delete the obsolete journal file under
      ** a RESERVED lock to avoid race conditions.
      */
      rc = unqliteOsFileSize(pPager->pfd,&n);
      if( rc==UNQLITE_OK ){
        if( n < 1 ){
          if( pager_lock_db(pPager, RESERVED_LOCK)==UNQLITE_OK ){
            unqliteOsDelete(pVfs, pPager->zJournal, 0);
			pager_unlock_db(pPager, SHARED_LOCK);
          }
        }else{
          /* The journal file exists and no other connection has a reserved
          ** or greater lock on the database file. */
			*pExists = 1;
        }
      }
    }
  }
  return rc;
}